

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::LinkLastPhisToStart
          (LoopUnrollerUtilsImpl *this,Loop *loop)

{
  Instruction *pIVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t uVar2;
  Instruction *pIVar3;
  const_reference ppIVar4;
  reference ppIVar5;
  uint32_t local_d4;
  iterator local_d0;
  undefined8 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  uint32_t local_94;
  iterator local_90;
  undefined8 local_88;
  SmallVector<unsigned_int,_2UL> local_80;
  Instruction *local_58;
  Instruction *phi;
  uint32_t local_48;
  uint32_t phi_label;
  uint32_t phi_variable;
  uint32_t phi_index;
  Instruction *last_phi_in_block;
  size_t i;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  Loop *loop_local;
  LoopUnrollerUtilsImpl *this_local;
  
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)loop;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &i);
  Loop::GetInductionVariables
            ((Loop *)inductions.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &i);
  last_phi_in_block = (Instruction *)0x0;
  while( true ) {
    pIVar1 = last_phi_in_block;
    pIVar3 = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             size((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&i);
    if (pIVar3 <= pIVar1) break;
    ppIVar4 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              operator[](&(this->state_).previous_phis_,(size_type)last_phi_in_block);
    _phi_variable = *ppIVar4;
    phi_label = GetPhiIndexFromLabel((this->state_).previous_latch_block_,_phi_variable);
    local_48 = Instruction::GetSingleWordInOperand(_phi_variable,phi_label - 1);
    phi._4_4_ = Instruction::GetSingleWordInOperand(_phi_variable,phi_label);
    ppIVar5 = std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              operator[]((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)&i,(size_type)last_phi_in_block);
    pIVar1 = *ppIVar5;
    uVar2 = phi_label - 1;
    local_94 = local_48;
    local_90 = &local_94;
    local_88 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_90;
    local_58 = pIVar1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80,init_list_00);
    Instruction::SetInOperand(pIVar1,uVar2,&local_80);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80);
    uVar2 = phi_label;
    pIVar1 = local_58;
    local_d4 = phi._4_4_;
    local_d0 = &local_d4;
    local_c8 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_d0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,init_list);
    Instruction::SetInOperand(pIVar1,uVar2,&local_c0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0);
    last_phi_in_block =
         (Instruction *)
         ((long)&(last_phi_in_block->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                 _vptr_IntrusiveNodeBase + 1);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &i);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::LinkLastPhisToStart(Loop* loop) const {
  std::vector<Instruction*> inductions;
  loop->GetInductionVariables(inductions);

  for (size_t i = 0; i < inductions.size(); ++i) {
    Instruction* last_phi_in_block = state_.previous_phis_[i];

    uint32_t phi_index =
        GetPhiIndexFromLabel(state_.previous_latch_block_, last_phi_in_block);
    uint32_t phi_variable =
        last_phi_in_block->GetSingleWordInOperand(phi_index - 1);
    uint32_t phi_label = last_phi_in_block->GetSingleWordInOperand(phi_index);

    Instruction* phi = inductions[i];
    phi->SetInOperand(phi_index - 1, {phi_variable});
    phi->SetInOperand(phi_index, {phi_label});
  }
}